

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O3

int ARGBAttenuate(uint8_t *src_argb,int src_stride_argb,uint8_t *dst_argb,int dst_stride_argb,
                 int width,int height)

{
  int iVar1;
  uint uVar2;
  code *pcVar3;
  code *pcVar4;
  
  iVar1 = -1;
  if ((height != 0 && 0 < width) && (dst_argb != (uint8_t *)0x0 && src_argb != (uint8_t *)0x0)) {
    iVar1 = height;
    if (height < 0) {
      iVar1 = -height;
      src_argb = src_argb + ~height * src_stride_argb;
      src_stride_argb = -src_stride_argb;
    }
    if (width * 4 == dst_stride_argb && src_stride_argb == width * 4) {
      width = iVar1 * width;
      src_stride_argb = 0;
      dst_stride_argb = 0;
      iVar1 = 1;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((width & 3U) == 0) {
      pcVar4 = ARGBAttenuateRow_SSSE3;
    }
    else {
      pcVar4 = ARGBAttenuateRow_Any_SSSE3;
    }
    if ((uVar2 & 0x40) == 0) {
      pcVar4 = ARGBAttenuateRow_C;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((width & 7U) == 0) {
      pcVar3 = ARGBAttenuateRow_AVX2;
    }
    else {
      pcVar3 = ARGBAttenuateRow_Any_AVX2;
    }
    if ((uVar2 >> 10 & 1) == 0) {
      pcVar3 = pcVar4;
    }
    do {
      (*pcVar3)(src_argb,dst_argb,width);
      src_argb = src_argb + src_stride_argb;
      dst_argb = dst_argb + dst_stride_argb;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int ARGBAttenuate(const uint8_t* src_argb,
                  int src_stride_argb,
                  uint8_t* dst_argb,
                  int dst_stride_argb,
                  int width,
                  int height) {
  int y;
  void (*ARGBAttenuateRow)(const uint8_t* src_argb, uint8_t* dst_argb,
                           int width) = ARGBAttenuateRow_C;
  if (!src_argb || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  if (height < 0) {
    height = -height;
    src_argb = src_argb + (height - 1) * src_stride_argb;
    src_stride_argb = -src_stride_argb;
  }
  // Coalesce rows.
  if (src_stride_argb == width * 4 && dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    src_stride_argb = dst_stride_argb = 0;
  }
#if defined(HAS_ARGBATTENUATEROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    ARGBAttenuateRow = ARGBAttenuateRow_Any_SSSE3;
    if (IS_ALIGNED(width, 4)) {
      ARGBAttenuateRow = ARGBAttenuateRow_SSSE3;
    }
  }
#endif
#if defined(HAS_ARGBATTENUATEROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    ARGBAttenuateRow = ARGBAttenuateRow_Any_AVX2;
    if (IS_ALIGNED(width, 8)) {
      ARGBAttenuateRow = ARGBAttenuateRow_AVX2;
    }
  }
#endif
#if defined(HAS_ARGBATTENUATEROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ARGBAttenuateRow = ARGBAttenuateRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      ARGBAttenuateRow = ARGBAttenuateRow_NEON;
    }
  }
#endif
#if defined(HAS_ARGBATTENUATEROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ARGBAttenuateRow = ARGBAttenuateRow_Any_MMI;
    if (IS_ALIGNED(width, 2)) {
      ARGBAttenuateRow = ARGBAttenuateRow_MMI;
    }
  }
#endif
#if defined(HAS_ARGBATTENUATEROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    ARGBAttenuateRow = ARGBAttenuateRow_Any_MSA;
    if (IS_ALIGNED(width, 8)) {
      ARGBAttenuateRow = ARGBAttenuateRow_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    ARGBAttenuateRow(src_argb, dst_argb, width);
    src_argb += src_stride_argb;
    dst_argb += dst_stride_argb;
  }
  return 0;
}